

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

void __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
Char_Parser(Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_match,
           bool t_interpolation_allowed)

{
  bool t_interpolation_allowed_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_match_local;
  Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  this->match = t_match;
  this->is_escaped = false;
  this->is_interpolated = false;
  this->saw_interpolation_marker = false;
  this->is_octal = false;
  this->is_hex = false;
  this->unicode_size = 0;
  this->interpolation_allowed = t_interpolation_allowed;
  std::__cxx11::string::string((string *)&this->octal_matches);
  std::__cxx11::string::string((string *)&this->hex_matches);
  return;
}

Assistant:

Char_Parser(string_type &t_match, const bool t_interpolation_allowed)
            : match(t_match)
            , interpolation_allowed(t_interpolation_allowed) {
        }